

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void ClearDictionary(void)

{
  DictionaryEntry *pDVar1;
  DictionaryEntry *__ptr;
  
  __ptr = dictionary_head;
  while (__ptr != (DictionaryEntry *)0x0) {
    pDVar1 = __ptr->next;
    free(__ptr);
    __ptr = pDVar1;
  }
  dictionary_head = (DictionaryEntry *)0x0;
  return;
}

Assistant:

void ClearDictionary(void)
{
	DictionaryEntry *entry = dictionary_head;
	while (entry != NULL)
	{
		DictionaryEntry *next_entry = entry->next;
		free(entry);
		entry = next_entry;
	}

	dictionary_head = NULL;
}